

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int emit_server_name_extension(ptls_buffer_t *buf,char *server_name)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ptls_buffer_t *in_RSI;
  long *in_RDI;
  size_t body_size;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_start;
  size_t capacity;
  int ret;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  long *src;
  ptls_buffer_t *in_stack_ffffffffffffff88;
  long local_38;
  long local_20;
  int local_14;
  
  local_20 = 2;
  local_14 = ptls_buffer__do_pushv
                       (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff78);
  if (local_14 == 0) {
    lVar1 = in_RDI[2];
    local_14 = ptls_buffer__do_pushv
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
    if (local_14 == 0) {
      local_38 = 2;
      local_14 = ptls_buffer__do_pushv
                           (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78);
      if (local_14 == 0) {
        lVar2 = in_RDI[2];
        src = in_RDI;
        strlen((char *)in_RSI);
        local_14 = ptls_buffer__do_pushv(in_RSI,src,in_stack_ffffffffffffff78);
        if (local_14 == 0) {
          lVar3 = in_RDI[2];
          for (; local_38 != 0; local_38 = local_38 + -1) {
            *(char *)(*in_RDI + (lVar2 - local_38)) =
                 (char)((ulong)(lVar3 - lVar2) >> (((char)local_38 + -1) * '\b' & 0x3fU));
          }
          lVar2 = in_RDI[2];
          for (; local_20 != 0; local_20 = local_20 + -1) {
            *(char *)(*in_RDI + (lVar1 - local_20)) =
                 (char)((ulong)(lVar2 - lVar1) >> (((char)local_20 + -1) * '\b' & 0x3fU));
          }
          local_14 = 0;
        }
      }
    }
  }
  return local_14;
}

Assistant:

static int emit_server_name_extension(ptls_buffer_t *buf, const char *server_name)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, PTLS_SERVER_NAME_TYPE_HOSTNAME);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, server_name, strlen(server_name)); });
    });

    ret = 0;
Exit:
    return ret;
}